

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O2

bool __thiscall kj::CidrRange::matches(CidrRange *this,sockaddr *addr)

{
  uint uVar1;
  bool bVar2;
  long lStack_40;
  ArrayPtr<const_unsigned_char> local_38;
  ArrayPtr<const_unsigned_char> local_28;
  
  if (this->family == 10) {
    if (addr->sa_family != 10) {
      return false;
    }
    lStack_40 = 8;
  }
  else {
    if (this->family != 2) {
      kj::_::unreachable();
    }
    if (addr->sa_family == 2) {
      lStack_40 = 4;
    }
    else {
      if (addr->sa_family != 10) {
        return false;
      }
      local_28.ptr = (uchar *)(addr->sa_data + 6);
      local_28.size_ = 0xc;
      local_38.ptr = "";
      local_38.size_ = 0xc;
      bVar2 = ArrayPtr<const_unsigned_char>::operator==(&local_28,&local_38);
      if (!bVar2) {
        return false;
      }
      lStack_40 = 0x14;
    }
  }
  local_38.size_ = (size_t)(this->bitCount >> 3);
  local_38.ptr = (uchar *)(addr->sa_data + lStack_40 + -2);
  local_28.ptr = this->bits;
  local_28.size_ = local_38.size_;
  bVar2 = ArrayPtr<const_unsigned_char>::operator==(&local_28,&local_38);
  if (!bVar2) {
    return false;
  }
  uVar1 = this->bitCount;
  if (uVar1 != 0x80) {
    return (0xff00U >> ((byte)uVar1 & 7) & (uint)(byte)(addr->sa_data + lStack_40 + -2)[uVar1 >> 3])
           == (uint)this->bits[uVar1 >> 3];
  }
  return true;
}

Assistant:

bool CidrRange::matches(const struct sockaddr* addr) const {
  const byte* otherBits;

  switch (family) {
    case AF_INET:
      if (addr->sa_family == AF_INET6) {
        otherBits = reinterpret_cast<const struct sockaddr_in6*>(addr)->sin6_addr.s6_addr;
        static constexpr byte V6MAPPED[12] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0xff };
        if (arrayPtr(otherBits, sizeof(V6MAPPED)) == V6MAPPED) {
          // We're an ipv4 range and the address is ipv6, but it's a "v6 mapped" address, meaning
          // it's equivalent to an ipv4 address. Try to match against the ipv4 part.
          otherBits = otherBits + sizeof(V6MAPPED);
        } else {
          return false;
        }
      } else if (addr->sa_family == AF_INET) {
        otherBits = reinterpret_cast<const byte*>(
            &reinterpret_cast<const struct sockaddr_in*>(addr)->sin_addr.s_addr);
      } else {
        return false;
      }

      break;

    case AF_INET6:
      if (addr->sa_family != AF_INET6) return false;

      otherBits = reinterpret_cast<const struct sockaddr_in6*>(addr)->sin6_addr.s6_addr;
      break;

    default:
      KJ_UNREACHABLE;
  }

  if (arrayPtr(bits).first(bitCount / 8) != arrayPtr(otherBits, bitCount / 8)) return false;

  return bitCount == 128 ||
      bits[bitCount / 8] == (otherBits[bitCount / 8] & (0xff00 >> (bitCount % 8)));
}